

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.hpp
# Opt level: O0

bool CheckCin(void)

{
  ulong uVar1;
  bool local_9;
  
  uVar1 = std::ios::fail();
  local_9 = (uVar1 & 1) != 0;
  if (local_9) {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x7fff);
  }
  local_9 = !local_9;
  return local_9;
}

Assistant:

bool CheckCin() {
    if (std::cin.fail()) {
        std::cin.clear();
        std::cin.ignore(32767, '\n');
        return false;
    }
    return true;
}